

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O2

bool cmExportCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  cmMakefile *pcVar1;
  char *pcVar2;
  pointer this;
  pointer pbVar3;
  size_type sVar4;
  bool bVar5;
  bool bVar6;
  PolicyStatus PVar7;
  TargetType TVar8;
  ostream *poVar9;
  string *psVar10;
  cmGlobalGenerator *this_00;
  iterator iVar11;
  cmExportBuildFileGenerator *pcVar12;
  cmTarget *this_01;
  PolicyID id;
  string *ct;
  pointer config;
  ulong uVar13;
  long lVar14;
  undefined8 name;
  cmExportSet *exportSet;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  string_view name_04;
  static_string_view name_05;
  static_string_view name_06;
  static_string_view name_07;
  string fname_1;
  string fname;
  _Head_base<0UL,_cmExportBuildFileGenerator_*,_false> local_590;
  string package;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  string local_550;
  size_type local_530;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  byte local_4e8 [8];
  _Manager_type p_Stack_4e0;
  _Invoker_type local_4d8;
  undefined1 auStack_4d0 [8];
  _Function_base local_4c8;
  pointer ppStack_4b0;
  pointer local_4a8;
  pointer ppStack_4a0;
  Arguments arguments;
  string local_120 [32];
  cmArgumentParser<Arguments> parser;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)__lhs) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configurationTypes,"called with too few arguments",
               (allocator<char> *)&arguments);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&configurationTypes);
    return false;
  }
  bVar5 = std::operator==(__lhs,"PACKAGE");
  if (bVar5) {
    package._M_dataplus._M_p = (pointer)&package.field_2;
    package._M_string_length = 0;
    package.field_2._M_local_buf[0] = '\0';
    lVar14 = 0x20;
    for (uVar13 = 1;
        uVar13 < (ulong)((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 5); uVar13 = uVar13 + 1
        ) {
      if (lVar14 == 0x40) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
        poVar9 = std::operator<<((ostream *)&configurationTypes,"PACKAGE given unknown argument: ");
        std::operator<<(poVar9,(string *)
                               ((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 2));
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_assign((string *)&status->Error);
        std::__cxx11::string::~string((string *)&arguments);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&configurationTypes);
        goto LAB_002169b3;
      }
      std::__cxx11::string::_M_assign((string *)&package);
      lVar14 = lVar14 + 0x20;
    }
    if (package._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&configurationTypes,"PACKAGE must be given a package name.",
                 (allocator<char> *)&arguments);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      std::__cxx11::string::~string((string *)&configurationTypes);
LAB_002169b3:
      bVar5 = false;
      goto LAB_00217411;
    }
    cmsys::RegularExpression::RegularExpression((RegularExpression *)&parser,"^[A-Za-z0-9_.-]+$");
    bVar5 = cmsys::RegularExpression::find((RegularExpression *)&parser,package._M_dataplus._M_p);
    if (bVar5) {
      pcVar1 = status->Makefile;
      PVar7 = cmMakefile::GetPolicyStatus(pcVar1,CMP0090,false);
      if (PVar7 - NEW < 3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&configurationTypes,"CMAKE_EXPORT_PACKAGE_REGISTRY",
                   (allocator<char> *)&arguments);
        bVar6 = cmMakefile::IsOn(pcVar1,(string *)&configurationTypes);
        std::__cxx11::string::~string((string *)&configurationTypes);
        if (!bVar6) goto LAB_00217404;
      }
      else if (PVar7 < NEW) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&configurationTypes,"CMAKE_EXPORT_NO_PACKAGE_REGISTRY",
                   (allocator<char> *)&arguments);
        bVar6 = cmMakefile::IsOn(pcVar1,(string *)&configurationTypes);
        std::__cxx11::string::~string((string *)&configurationTypes);
        if (bVar6) goto LAB_00217404;
      }
      psVar10 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar1);
      cmSystemTools::ComputeStringMD5(&local_550,psVar10);
      pcVar2 = (psVar10->_M_dataplus)._M_p;
      fname_1._M_dataplus._M_p = (pointer)&fname_1.field_2;
      fname_1._M_string_length = 0;
      fname_1.field_2._M_local_buf[0] = '\0';
      bVar6 = cmsys::SystemTools::GetEnv("HOME",&fname_1);
      if (bVar6) {
        cmsys::SystemTools::ConvertToUnixSlashes(&fname_1);
        std::__cxx11::string::append((char *)&fname_1);
        std::__cxx11::string::append((string *)&fname_1);
        cmsys::SystemTools::MakeDirectory(&fname_1,(mode_t *)0x0);
        std::__cxx11::string::append((char *)&fname_1);
        std::__cxx11::string::append((char *)&fname_1);
        bVar6 = cmsys::SystemTools::FileExists(&fname_1);
        if (!bVar6) {
          cmGeneratedFileStream::cmGeneratedFileStream
                    ((cmGeneratedFileStream *)&configurationTypes,&fname_1,true,None);
          if ((local_4e8[configurationTypes.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length] & 5) == 0)
          {
            poVar9 = std::operator<<((ostream *)&configurationTypes,pcVar2);
            std::operator<<(poVar9,"\n");
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&arguments);
            poVar9 = std::operator<<((ostream *)&arguments,"Cannot create package registry file:\n")
            ;
            poVar9 = std::operator<<(poVar9,"  ");
            poVar9 = std::operator<<(poVar9,(string *)&fname_1);
            poVar9 = std::operator<<(poVar9,"\n");
            cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
            poVar9 = std::operator<<(poVar9,(string *)&fname);
            std::operator<<(poVar9,"\n");
            std::__cxx11::string::~string((string *)&fname);
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar1,WARNING,&fname);
            std::__cxx11::string::~string((string *)&fname);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&arguments);
          }
          cmGeneratedFileStream::~cmGeneratedFileStream
                    ((cmGeneratedFileStream *)&configurationTypes);
        }
      }
      std::__cxx11::string::~string((string *)&fname_1);
      std::__cxx11::string::~string((string *)&local_550);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
      poVar9 = std::operator<<((ostream *)&configurationTypes,
                               "PACKAGE given invalid package name \"");
      poVar9 = std::operator<<(poVar9,(string *)&package);
      poVar9 = std::operator<<(poVar9,"\".  ");
      poVar9 = std::operator<<(poVar9,"Package names must match \"");
      poVar9 = std::operator<<(poVar9,"^[A-Za-z0-9_.-]+$");
      std::operator<<(poVar9,"\".");
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&status->Error);
      std::__cxx11::string::~string((string *)&arguments);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&configurationTypes);
    }
LAB_00217404:
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)&parser);
LAB_00217411:
    std::__cxx11::string::~string((string *)&package);
    return bVar5;
  }
  local_4a8 = (pointer)0x0;
  ppStack_4a0 = (pointer)0x0;
  local_4c8._M_manager = (_Manager_type)0x0;
  ppStack_4b0 = (pointer)0x0;
  local_4c8._M_functor._0_8_ = 0;
  local_4c8._M_functor._8_8_ = (_Manager_type)0x0;
  local_4d8 = (_Invoker_type)0x0;
  auStack_4d0 = (undefined1  [8])0x0;
  local_4e8[0] = 0;
  local_4e8[1] = 0;
  local_4e8[2] = 0;
  local_4e8[3] = 0;
  local_4e8[4] = 0;
  local_4e8[5] = 0;
  local_4e8[6] = 0;
  local_4e8[7] = 0;
  p_Stack_4e0 = (_Manager_type)0x0;
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  name_00.super_string_view._M_str = "NAMESPACE";
  name_00.super_string_view._M_len = 9;
  cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)&configurationTypes,name_00,0x40);
  name_01.super_string_view._M_str = "FILE";
  name_01.super_string_view._M_len = 4;
  cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)&configurationTypes,name_01,0x60);
  ArgumentParser::ActionMap::ActionMap((ActionMap *)&parser,(ActionMap *)&configurationTypes);
  ArgumentParser::ActionMap::~ActionMap((ActionMap *)&configurationTypes);
  bVar5 = cmExperimental::HasSupportEnabled(status->Makefile,CxxModuleCMakeApi);
  if (bVar5) {
    name_02.super_string_view._M_str = "CXX_MODULES_DIRECTORY";
    name_02.super_string_view._M_len = 0x15;
    cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&parser,name_02,0xa0);
  }
  bVar5 = std::operator==((args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,"EXPORT");
  if (bVar5) {
    name_03.super_string_view._M_str = "EXPORT";
    name_03.super_string_view._M_len = 6;
    cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&parser,name_03,0);
  }
  else {
    configurationTypes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    configurationTypes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x20;
    configurationTypes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
                  ::_M_manager;
    name_04._M_str = "TARGETS";
    name_04._M_len = 7;
    ArgumentParser::Base::Bind(&parser.super_Base,name_04,(KeywordAction *)&configurationTypes);
    std::_Function_base::~_Function_base((_Function_base *)&configurationTypes);
    name_05.super_string_view._M_str = "ANDROID_MK";
    name_05.super_string_view._M_len = 10;
    cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&parser,name_05,0x80);
    name_06.super_string_view._M_str = "APPEND";
    name_06.super_string_view._M_len = 6;
    cmArgumentParser<Arguments>::Bind<bool>(&parser,name_06,0xc0);
    name_07.super_string_view._M_str = "EXPORT_LINK_INTERFACE_LIBRARIES";
    name_07.super_string_view._M_len = 0x1f;
    cmArgumentParser<Arguments>::Bind<bool>(&parser,name_07,0xc1);
  }
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&unknownArgs;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arguments.ExportSetName._M_dataplus._M_p = (pointer)&arguments.ExportSetName.field_2;
  arguments.ExportSetName._M_string_length = 0;
  arguments.ExportSetName.field_2._M_local_buf[0] = '\0';
  arguments.Targets.
  super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_engaged = false;
  arguments.Namespace._M_dataplus._M_p = (pointer)&arguments.Namespace.field_2;
  arguments.Namespace._M_string_length = 0;
  arguments.Namespace.field_2._M_local_buf[0] = '\0';
  arguments.Filename._M_dataplus._M_p = (pointer)&arguments.Filename.field_2;
  arguments.Filename._M_string_length = 0;
  arguments.Filename.field_2._M_local_buf[0] = '\0';
  arguments.AndroidMKFile._M_dataplus._M_p = (pointer)&arguments.AndroidMKFile.field_2;
  arguments.AndroidMKFile._M_string_length = 0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments.AndroidMKFile.field_2._M_local_buf[0] = '\0';
  arguments.CxxModulesDirectory._M_dataplus._M_p = (pointer)&arguments.CxxModulesDirectory.field_2;
  arguments.CxxModulesDirectory._M_string_length = 0;
  arguments.CxxModulesDirectory.field_2._M_local_buf[0] = '\0';
  arguments.Append = false;
  arguments.ExportOld = false;
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4e8[0] = 0;
  local_4e8[1] = 0;
  local_4e8[2] = 0;
  local_4e8[3] = 0;
  local_4e8[4] = 0;
  local_4e8[5] = 0;
  local_4e8[6] = 0;
  local_4e8[7] = 0;
  p_Stack_4e0 = (_Manager_type)0x0;
  local_4d8 = (_Invoker_type)0x0;
  auStack_4d0 = (undefined1  [8])0x0;
  local_4c8._M_functor._0_8_ = 0;
  local_4c8._M_functor._8_8_ = (_Manager_type)0x0;
  local_4c8._M_manager = (_Manager_type)0x0;
  ppStack_4b0 = (pointer)0x0;
  local_4a8 = (pointer)((ulong)local_4a8 & 0xffffffffffffff00);
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&parser;
  ArgumentParser::Instance::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Instance *)&configurationTypes,args,0);
  std::_Function_base::~_Function_base(&local_4c8);
  sVar4 = arguments.AndroidMKFile._M_string_length;
  if (unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator+(&fname_1,"Unknown argument: \"",
                   unknownArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &configurationTypes,&fname_1,"\".");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&configurationTypes);
    std::__cxx11::string::~string((string *)&fname_1);
    bVar5 = false;
    goto LAB_00217390;
  }
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_local_buf[0] = '\0';
  if (arguments.AndroidMKFile._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&fname);
  }
  if (arguments.Filename._M_string_length == 0) {
    if (fname._M_string_length != 0) goto LAB_00216d01;
    bVar5 = std::operator!=((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,"EXPORT");
    if (!bVar5) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &configurationTypes,&arguments.ExportSetName,".cmake");
      std::__cxx11::string::operator=((string *)&fname,(string *)&configurationTypes);
      std::__cxx11::string::~string((string *)&configurationTypes);
      goto LAB_00216d01;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configurationTypes,"FILE <filename> option missing.",
               (allocator<char> *)&fname_1);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&configurationTypes);
LAB_00216daa:
    bVar5 = false;
  }
  else {
    if (fname._M_string_length == 0) {
      cmsys::SystemTools::GetFilenameLastExtension
                ((string *)&configurationTypes,&arguments.Filename);
      bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &configurationTypes,".cmake");
      std::__cxx11::string::~string((string *)&configurationTypes);
      if (!bVar5) {
        std::__cxx11::string::_M_assign((string *)&fname);
        goto LAB_00216d01;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
      poVar9 = std::operator<<((ostream *)&configurationTypes,"FILE option given filename \"");
      poVar9 = std::operator<<(poVar9,(string *)&arguments.Filename);
      std::operator<<(poVar9,"\" which does not have an extension of \".cmake\".\n");
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00216d93:
      std::__cxx11::string::~string((string *)&fname_1);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&configurationTypes);
      goto LAB_00216daa;
    }
LAB_00216d01:
    pcVar1 = status->Makefile;
    bVar5 = cmsys::SystemTools::FileIsFullPath(&fname);
    local_530 = sVar4;
    if (bVar5) {
      bVar5 = cmMakefile::CanIWriteThisFile(pcVar1,&fname);
      if (!bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
        poVar9 = std::operator<<((ostream *)&configurationTypes,"FILE option given filename \"");
        poVar9 = std::operator<<(poVar9,(string *)&fname);
        std::operator<<(poVar9,"\" which is in the source tree.\n");
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_00216d93;
      }
    }
    else {
      psVar10 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar1);
      std::operator+(&fname_1,psVar10,"/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &configurationTypes,&fname_1,&fname);
      std::__cxx11::string::operator=((string *)&fname,(string *)&configurationTypes);
      std::__cxx11::string::~string((string *)&configurationTypes);
      std::__cxx11::string::~string((string *)&fname_1);
    }
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = cmMakefile::GetGlobalGenerator(pcVar1);
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,"EXPORT");
    if (bVar5) {
      iVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
                       *)&this_00->ExportSets,&arguments.ExportSetName);
      if ((_Rb_tree_header *)iVar11._M_node ==
          &(this_00->ExportSets).
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
           ._M_t._M_impl.super__Rb_tree_header) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
        poVar9 = std::operator<<((ostream *)&configurationTypes,"Export set \"");
        poVar9 = std::operator<<(poVar9,(string *)&arguments);
        std::operator<<(poVar9,"\" not found.");
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00217306:
        std::__cxx11::string::~string((string *)&fname_1);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&configurationTypes);
LAB_00217377:
        bVar5 = false;
      }
      else {
        exportSet = (cmExportSet *)(iVar11._M_node + 2);
LAB_00216e6e:
        pcVar12 = cmGlobalGenerator::GetExportedTargetsFile(this_00,&fname);
        if ((pcVar12 != (cmExportBuildFileGenerator *)0x0) &&
           (PVar7 = cmMakefile::GetPolicyStatus(pcVar1,CMP0103,false), PVar7 != OLD)) {
          if (PVar7 != WARN) {
            configurationTypes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000029;
            configurationTypes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x59ed23;
            fname_1._M_dataplus._M_p = (pointer)arguments.Filename._M_string_length;
            fname_1._M_string_length = (size_type)arguments.Filename._M_dataplus._M_p;
            cmStrCat<char[32]>(&package,(cmAlphaNum *)&configurationTypes,(cmAlphaNum *)&fname_1,
                               (char (*) [32])"\nDid you miss \'APPEND\' keyword?");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            psVar10 = &package;
            goto LAB_00217372;
          }
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_550,(cmPolicies *)0x67,id);
          configurationTypes.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_550._M_string_length;
          configurationTypes.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_550._M_dataplus._M_p;
          fname_1._M_string_length = (size_type)&fname_1.field_2;
          fname_1._M_dataplus._M_p = (pointer)0x1;
          fname_1.field_2._M_local_buf[0] = '\n';
          cmStrCat<char[51],std::__cxx11::string,char[32]>
                    (&package,(cmAlphaNum *)&configurationTypes,(cmAlphaNum *)&fname_1,
                     (char (*) [51])"export() command already specified for the file\n  ",
                     &arguments.Filename,(char (*) [32])"\nDid you miss \'APPEND\' keyword?");
          cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&package);
          std::__cxx11::string::~string((string *)&package);
          std::__cxx11::string::~string((string *)&local_550);
        }
        if (local_530 == 0) {
          std::make_unique<cmExportBuildFileGenerator>();
        }
        else {
          std::make_unique<cmExportBuildAndroidMKGenerator>();
        }
        this = configurationTypes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        cmExportFileGenerator::SetExportFile
                  ((cmExportFileGenerator *)
                   configurationTypes.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,fname._M_dataplus._M_p);
        std::__cxx11::string::_M_assign((string *)&this->_M_string_length);
        std::__cxx11::string::string(local_120,(string *)&arguments.CxxModulesDirectory);
        std::__cxx11::string::operator=((string *)(this[10].field_2._M_local_buf + 8),local_120);
        std::__cxx11::string::~string(local_120);
        *(bool *)&this[6]._M_string_length = arguments.Append;
        if (exportSet == (cmExportSet *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&this[8].field_2 + 8),&targets);
        }
        else {
          cmExportBuildFileGenerator::SetExportSet((cmExportBuildFileGenerator *)this,exportSet);
        }
        *(bool *)&this[1]._M_string_length = arguments.ExportOld;
        cmMakefile::GetGeneratorConfigs_abi_cxx11_(&configurationTypes,pcVar1,IncludeEmptyConfig);
        pbVar3 = configurationTypes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (config = configurationTypes.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; config != pbVar3;
            config = config + 1) {
          cmExportFileGenerator::AddConfiguration((cmExportFileGenerator *)this,config);
        }
        if (exportSet == (cmExportSet *)0x0) {
          cmGlobalGenerator::AddBuildExportSet(this_00,(cmExportBuildFileGenerator *)this);
        }
        else {
          cmGlobalGenerator::AddBuildExportExportSet(this_00,(cmExportBuildFileGenerator *)this);
        }
        local_590._M_head_impl = (cmExportBuildFileGenerator *)this;
        cmMakefile::AddExportBuildFileGenerator
                  (pcVar1,(unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                           *)&local_590);
        if (local_590._M_head_impl != (cmExportBuildFileGenerator *)0x0) {
          (*((local_590._M_head_impl)->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[1])
                    ();
        }
        local_590._M_head_impl = (cmExportBuildFileGenerator *)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&configurationTypes);
        bVar5 = true;
      }
    }
    else {
      if (arguments.Targets.
          super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_engaged != true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&configurationTypes,"EXPORT or TARGETS specifier missing.",
                   (allocator<char> *)&fname_1);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        psVar10 = (string *)&configurationTypes;
LAB_00217372:
        std::__cxx11::string::~string((string *)psVar10);
        goto LAB_00217377;
      }
      for (name = arguments.Targets.
                  super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_payload._M_value.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          (pointer)name !=
          arguments.Targets.
          super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_payload._M_value.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; name = name + 0x20) {
        bVar5 = cmMakefile::IsAlias(pcVar1,(string *)name);
        if (bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
          poVar9 = std::operator<<((ostream *)&configurationTypes,"given ALIAS target \"");
          poVar9 = std::operator<<(poVar9,(string *)name);
          std::operator<<(poVar9,"\" which may not be exported.");
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00217306;
        }
        this_01 = cmGlobalGenerator::FindTarget(this_00,(string *)name,false);
        if (this_01 == (cmTarget *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
          poVar9 = std::operator<<((ostream *)&configurationTypes,"given target \"");
          poVar9 = std::operator<<(poVar9,(string *)name);
          std::operator<<(poVar9,"\" which is not built by this project.");
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00217306;
        }
        TVar8 = cmTarget::GetType(this_01);
        if (TVar8 == UTILITY) {
          std::operator+(&fname_1,"given custom target \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &configurationTypes,&fname_1,"\" which may not be exported.");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          std::__cxx11::string::~string((string *)&configurationTypes);
          psVar10 = &fname_1;
          goto LAB_00217372;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&targets,(value_type *)name);
      }
      if ((arguments.Append != true) ||
         (pcVar12 = cmGlobalGenerator::GetExportedTargetsFile(this_00,&fname),
         pcVar12 == (cmExportBuildFileGenerator *)0x0)) {
        exportSet = (cmExportSet *)0x0;
        goto LAB_00216e6e;
      }
      bVar5 = true;
      cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                (&pcVar12->Targets,&targets);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&targets);
  }
  std::__cxx11::string::~string((string *)&fname);
LAB_00217390:
  cmExportCommand::Arguments::~Arguments(&arguments);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unknownArgs);
  ArgumentParser::ActionMap::~ActionMap((ActionMap *)&parser);
  return bVar5;
}

Assistant:

bool cmExportCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with too few arguments");
    return false;
  }

  if (args[0] == "PACKAGE") {
    return HandlePackage(args, status);
  }

  struct Arguments
  {
    std::string ExportSetName;
    cm::optional<ArgumentParser::MaybeEmpty<std::vector<std::string>>> Targets;
    std::string Namespace;
    std::string Filename;
    std::string AndroidMKFile;
    std::string CxxModulesDirectory;
    bool Append = false;
    bool ExportOld = false;
  };

  auto parser = cmArgumentParser<Arguments>{}
                  .Bind("NAMESPACE"_s, &Arguments::Namespace)
                  .Bind("FILE"_s, &Arguments::Filename);

  bool const supportCxx20FileSetTypes = cmExperimental::HasSupportEnabled(
    status.GetMakefile(), cmExperimental::Feature::CxxModuleCMakeApi);
  if (supportCxx20FileSetTypes) {
    parser.Bind("CXX_MODULES_DIRECTORY"_s, &Arguments::CxxModulesDirectory);
  }

  if (args[0] == "EXPORT") {
    parser.Bind("EXPORT"_s, &Arguments::ExportSetName);
  } else {
    parser.Bind("TARGETS"_s, &Arguments::Targets);
    parser.Bind("ANDROID_MK"_s, &Arguments::AndroidMKFile);
    parser.Bind("APPEND"_s, &Arguments::Append);
    parser.Bind("EXPORT_LINK_INTERFACE_LIBRARIES"_s, &Arguments::ExportOld);
  }

  std::vector<std::string> unknownArgs;
  Arguments const arguments = parser.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    status.SetError("Unknown argument: \"" + unknownArgs.front() + "\".");
    return false;
  }

  std::string fname;
  bool android = false;
  if (!arguments.AndroidMKFile.empty()) {
    fname = arguments.AndroidMKFile;
    android = true;
  }
  if (arguments.Filename.empty() && fname.empty()) {
    if (args[0] != "EXPORT") {
      status.SetError("FILE <filename> option missing.");
      return false;
    }
    fname = arguments.ExportSetName + ".cmake";
  } else if (fname.empty()) {
    // Make sure the file has a .cmake extension.
    if (cmSystemTools::GetFilenameLastExtension(arguments.Filename) !=
        ".cmake") {
      std::ostringstream e;
      e << "FILE option given filename \"" << arguments.Filename
        << "\" which does not have an extension of \".cmake\".\n";
      status.SetError(e.str());
      return false;
    }
    fname = arguments.Filename;
  }

  cmMakefile& mf = status.GetMakefile();

  // Get the file to write.
  if (cmSystemTools::FileIsFullPath(fname)) {
    if (!mf.CanIWriteThisFile(fname)) {
      std::ostringstream e;
      e << "FILE option given filename \"" << fname
        << "\" which is in the source tree.\n";
      status.SetError(e.str());
      return false;
    }
  } else {
    // Interpret relative paths with respect to the current build dir.
    std::string const& dir = mf.GetCurrentBinaryDirectory();
    fname = dir + "/" + fname;
  }

  std::vector<std::string> targets;

  cmGlobalGenerator* gg = mf.GetGlobalGenerator();

  cmExportSet* exportSet = nullptr;
  if (args[0] == "EXPORT") {
    cmExportSetMap& setMap = gg->GetExportSets();
    auto const it = setMap.find(arguments.ExportSetName);
    if (it == setMap.end()) {
      std::ostringstream e;
      e << "Export set \"" << arguments.ExportSetName << "\" not found.";
      status.SetError(e.str());
      return false;
    }
    exportSet = &it->second;
  } else if (arguments.Targets) {
    for (std::string const& currentTarget : *arguments.Targets) {
      if (mf.IsAlias(currentTarget)) {
        std::ostringstream e;
        e << "given ALIAS target \"" << currentTarget
          << "\" which may not be exported.";
        status.SetError(e.str());
        return false;
      }

      if (cmTarget* target = gg->FindTarget(currentTarget)) {
        if (target->GetType() == cmStateEnums::UTILITY) {
          status.SetError("given custom target \"" + currentTarget +
                          "\" which may not be exported.");
          return false;
        }
      } else {
        std::ostringstream e;
        e << "given target \"" << currentTarget
          << "\" which is not built by this project.";
        status.SetError(e.str());
        return false;
      }
      targets.push_back(currentTarget);
    }
    if (arguments.Append) {
      if (cmExportBuildFileGenerator* ebfg =
            gg->GetExportedTargetsFile(fname)) {
        ebfg->AppendTargets(targets);
        return true;
      }
    }
  } else {
    status.SetError("EXPORT or TARGETS specifier missing.");
    return false;
  }

  // if cmExportBuildFileGenerator is already defined for the file
  // and APPEND is not specified, if CMP0103 is OLD ignore previous definition
  // else raise an error
  if (gg->GetExportedTargetsFile(fname) != nullptr) {
    switch (mf.GetPolicyStatus(cmPolicies::CMP0103)) {
      case cmPolicies::WARN:
        mf.IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0103), '\n',
                   "export() command already specified for the file\n  ",
                   arguments.Filename, "\nDid you miss 'APPEND' keyword?"));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      default:
        status.SetError(cmStrCat("command already specified for the file\n  ",
                                 arguments.Filename,
                                 "\nDid you miss 'APPEND' keyword?"));
        return false;
    }
  }

  // Setup export file generation.
  std::unique_ptr<cmExportBuildFileGenerator> ebfg = nullptr;
  if (android) {
    ebfg = cm::make_unique<cmExportBuildAndroidMKGenerator>();
  } else {
    ebfg = cm::make_unique<cmExportBuildFileGenerator>();
  }
  ebfg->SetExportFile(fname.c_str());
  ebfg->SetNamespace(arguments.Namespace);
  ebfg->SetCxxModuleDirectory(arguments.CxxModulesDirectory);
  ebfg->SetAppendMode(arguments.Append);
  if (exportSet != nullptr) {
    ebfg->SetExportSet(exportSet);
  } else {
    ebfg->SetTargets(targets);
  }
  ebfg->SetExportOld(arguments.ExportOld);

  // Compute the set of configurations exported.
  std::vector<std::string> configurationTypes =
    mf.GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  for (std::string const& ct : configurationTypes) {
    ebfg->AddConfiguration(ct);
  }
  if (exportSet != nullptr) {
    gg->AddBuildExportExportSet(ebfg.get());
  } else {
    gg->AddBuildExportSet(ebfg.get());
  }
  mf.AddExportBuildFileGenerator(std::move(ebfg));

  return true;
}